

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  int iVar1;
  CornerTable *pCVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  int *piVar5;
  _Bit_type *p_Var6;
  ulong *puVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  int i;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  Scalar ret_6;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Scalar ret_2;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  float fVar27;
  float fVar28;
  Scalar ret_3;
  float fVar29;
  Vector3f pn;
  Vector3f cn;
  Self ret_4;
  Self ret_5;
  Vector3f tip_pos;
  Vector3f next_pos;
  Vector3f prev_pos;
  float local_b8 [4];
  float local_a8 [4];
  undefined8 local_98;
  float local_90 [4];
  float local_80 [3];
  undefined1 local_74 [20];
  double dStack_60;
  undefined1 local_58 [24];
  undefined1 local_40 [12];
  undefined1 local_34 [12];
  undefined1 local_28 [16];
  
  uVar15 = 0xffffffffffffffff;
  if (corner_id.value_ == 0xffffffff) {
    IVar11.value_ = 0xffffffff;
  }
  else {
    uVar26 = corner_id.value_ - 2;
    if (0x55555555 < corner_id.value_ * -0x55555555 + 0xaaaaaaab) {
      uVar26 = corner_id.value_ + 1;
    }
    uVar18 = ((corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner_id.value_;
    pCVar2 = (this->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ).mesh_data_.corner_table_;
    if (uVar26 == 0xffffffff) {
      IVar11.value_ = 0xffffffff;
    }
    else {
      IVar11.value_ =
           (pCVar2->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar26].value_;
    }
    if (uVar18 != 0xffffffff) {
      uVar15 = (ulong)(int)(pCVar2->corner_to_vertex_map_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar18].value_;
    }
  }
  pvVar3 = (this->
           super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           ).mesh_data_.vertex_to_data_map_;
  uVar20 = (ulong)(int)IVar11.value_;
  piVar4 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar12 = (long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  uVar17 = uVar20;
  if ((uVar12 <= uVar20) || (uVar17 = uVar15, uVar12 <= uVar15)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17,
               uVar12);
  }
  iVar19 = piVar4[uVar20];
  if ((piVar4[uVar15] < data_id) && (iVar19 < data_id)) {
    local_74._12_4_ = (undefined4)(int)*(undefined8 *)(data + this->num_components_ * iVar19);
    local_74._16_4_ =
         (undefined4)(int)((ulong)*(undefined8 *)(data + this->num_components_ * iVar19) >> 0x20);
    local_58._0_4_ = (undefined4)(int)*(undefined8 *)(data + this->num_components_ * piVar4[uVar15])
    ;
    local_58._4_4_ =
         (undefined4)
         (int)((ulong)*(undefined8 *)(data + this->num_components_ * piVar4[uVar15]) >> 0x20);
    local_98 = CONCAT44(local_58._4_4_,local_58._0_4_);
    bVar14 = true;
    pfVar16 = (float *)&local_98;
    fVar23 = (float)local_74._12_4_;
    while (fVar22 = fVar23, fVar29 = *pfVar16, bVar14) {
      bVar14 = false;
      if ((fVar29 != fVar22) ||
         (pfVar16 = (float *)((long)&local_98 + 4), fVar23 = (float)local_74._16_4_,
         NAN(fVar29) || NAN(fVar22))) break;
    }
    if ((fVar29 != fVar22) || (NAN(fVar29) || NAN(fVar22))) {
      dStack_60 = 0.0;
      local_58._8_8_ = 0;
      iVar19 = (int)this;
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  *)local_74,iVar19);
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  *)local_40,iVar19);
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  *)local_34,iVar19);
      local_b8[2] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      lVar13 = 0;
      do {
        local_b8[lVar13] = *(float *)(local_34 + lVar13 * 4) - *(float *)(local_40 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_a8[2] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      lVar13 = 0;
      do {
        local_a8[lVar13] = *(float *)(local_74 + lVar13 * 4) - *(float *)(local_40 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      fVar23 = 0.0;
      lVar13 = 0;
      do {
        fVar23 = fVar23 + local_b8[lVar13] * local_b8[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      fVar29 = 0.0;
      if ((0.0 < fVar23) || (fVar22 = 0.0, this->version_ < 0x102)) {
        lVar13 = 0;
        do {
          fVar29 = fVar29 + local_b8[lVar13] * local_a8[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        fVar29 = fVar29 / fVar23;
        local_90[2] = 0.0;
        local_90[0] = 0.0;
        local_90[1] = 0.0;
        lVar13 = 0;
        do {
          local_90[lVar13] = local_b8[lVar13] * fVar29;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_80[2] = 0.0;
        local_80[0] = 0.0;
        local_80[1] = 0.0;
        lVar13 = 0;
        do {
          local_80[lVar13] = local_a8[lVar13] - local_90[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        fVar22 = 0.0;
        lVar13 = 0;
        do {
          fVar22 = fVar22 + local_80[lVar13] * local_80[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        fVar22 = fVar22 / fVar23;
        if (fVar22 < 0.0) {
          local_28 = ZEXT416((uint)fVar29);
          fVar22 = sqrtf(fVar22);
          fVar29 = (float)local_28._0_4_;
        }
        else {
          fVar22 = SQRT(fVar22);
        }
      }
      p_Var6 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar26 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      bVar21 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != p_Var6;
      bVar14 = uVar26 != 0 || bVar21;
      if (uVar26 != 0 || bVar21) {
        fVar27 = (float)local_58._0_4_ - (float)local_74._12_8_;
        fVar28 = (float)local_58._4_4_ - SUB84(local_74._12_8_,4);
        fVar23 = fVar22 * fVar27;
        fVar22 = fVar28 * fVar22;
        uVar15 = (ulong)uVar26 - 1;
        uVar17 = (ulong)uVar26 + 0x3e;
        if (-1 < (long)uVar15) {
          uVar17 = uVar15;
        }
        uVar17 = p_Var6[((long)uVar17 >> 6) +
                        ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)];
        (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar26 - 1;
        if (uVar26 == 0) {
          (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var6 + -1;
        }
        puVar7 = (ulong *)(this->predicted_value_)._M_t.
                          super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl;
        uVar26 = (uint)((1L << ((byte)uVar15 & 0x3f) & uVar17) == 0);
        uVar18 = (int)(uVar26 << 0x1f) >> 0x1f;
        uVar26 = (int)(uVar26 << 0x1f) >> 0x1f;
        dVar9 = (double)(fVar29 * fVar27 + (float)local_74._12_8_ +
                        (float)(~uVar18 & (uint)-fVar22 | (uint)fVar22 & uVar18)) + 0.5;
        dVar10 = (double)(fVar29 * fVar28 + SUB84(local_74._12_8_,4) +
                         (float)(~uVar26 & (uint)fVar23 | (uint)-fVar23 & uVar26)) + 0.5;
        unique0x10000097 = SUB84(dVar10,0);
        local_74._12_8_ = dVar9;
        unique0x1000009b = (int)((ulong)dVar10 >> 0x20);
        dVar9 = floor(dVar9);
        local_58._8_4_ = extraout_XMM0_Dc;
        local_58._0_8_ = dVar9;
        local_58._12_4_ = extraout_XMM0_Dd;
        dVar9 = floor(dStack_60);
        auVar24._8_8_ = -(ulong)(2147483647.0 < dVar9);
        auVar24._0_8_ = -(ulong)(2147483647.0 < (double)local_58._0_8_);
        auVar8._8_4_ = (int)-(ulong)NAN(dVar9);
        auVar8._0_8_ = -(ulong)NAN((double)local_58._0_8_);
        auVar8._12_4_ = (int)(-(ulong)NAN(dVar9) >> 0x20);
        auVar25._8_8_ = -(ulong)(dVar9 < -2147483648.0);
        auVar25._0_8_ = -(ulong)((double)local_58._0_8_ < -2147483648.0);
        auVar25 = auVar25 | auVar24 | auVar8;
        uVar15 = CONCAT44(auVar25._8_4_,auVar25._0_4_);
        *puVar7 = uVar15 & (ulong)DAT_00162400 |
                  ~uVar15 & CONCAT44((int)dVar9,(int)(double)local_58._0_8_);
      }
    }
    else {
      local_74._0_8_ = (PredictionSchemeInterface)0x100000000;
      piVar5 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
               ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      lVar13 = 0;
      do {
        fVar23 = *(float *)((long)&local_98 + (long)*(int *)(local_74 + lVar13) * 4);
        iVar19 = -0x80000000;
        if (fVar23 <= 2.1474836e+09) {
          iVar19 = (int)fVar23;
        }
        if (NAN(fVar23)) {
          iVar19 = -0x80000000;
        }
        if (fVar23 < -2.1474836e+09) {
          iVar19 = -0x80000000;
        }
        piVar5[*(int *)(local_74 + lVar13)] = iVar19;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 8);
      bVar14 = true;
    }
  }
  else {
    if (data_id <= iVar19) {
      if (data_id < 1) {
        if (this->num_components_ < 1) {
          return true;
        }
        piVar5 = (this->predicted_value_)._M_t.
                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar13 = 0;
        do {
          piVar5[lVar13] = 0;
          lVar13 = lVar13 + 1;
        } while (lVar13 < this->num_components_);
        return true;
      }
      iVar19 = data_id + -1;
    }
    iVar1 = this->num_components_;
    bVar14 = true;
    if (0 < iVar1) {
      piVar5 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
               ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      lVar13 = 0;
      do {
        piVar5[lVar13] = data[iVar1 * iVar19 + lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 < this->num_components_);
    }
  }
  return bVar14;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputePredictedValue(CornerIndex corner_id, const DataTypeT *data,
                          int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id =
      this->mesh_data().corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      this->mesh_data().corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id =
      this->mesh_data().corner_table()->Vertex(next_corner_id).value();
  prev_vert_id =
      this->mesh_data().corner_table()->Vertex(prev_corner_id).value();

  next_data_id = this->mesh_data().vertex_to_data_map()->at(next_vert_id);
  prev_data_id = this->mesh_data().vertex_to_data_map()->at(prev_vert_id);

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vector2f n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vector2f p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      for (const int i : {0, 1}) {
        if (std::isnan(p_uv[i]) || static_cast<double>(p_uv[i]) > INT_MAX ||
            static_cast<double>(p_uv[i]) < INT_MIN) {
          predicted_value_[i] = INT_MIN;
        } else {
          predicted_value_[i] = static_cast<int>(p_uv[i]);
        }
      }
      return true;
    }

    // Get positions at all corners.
    const Vector3f tip_pos = GetPositionForEntryId(data_id);
    const Vector3f next_pos = GetPositionForEntryId(next_data_id);
    const Vector3f prev_pos = GetPositionForEntryId(prev_data_id);
    // Use the positions of the above triangle to predict the texture coordinate
    // on the tip corner C.
    // Convert the triangle into a new coordinate system defined by orthogonal
    // bases vectors S, T, where S is vector prev_pos - next_pos and T is an
    // perpendicular vector to S in the same plane as vector the
    // tip_pos - next_pos.
    // The transformed triangle in the new coordinate system is then going to
    // be represented as:
    //
    //        1 ^
    //          |
    //          |
    //          |   C
    //          |  /  \
    //          | /      \
    //          |/          \
    //          N--------------P
    //          0              1
    //
    // Where next_pos point (N) is at position (0, 0), prev_pos point (P) is
    // at (1, 0). Our goal is to compute the position of the tip_pos point (C)
    // in this new coordinate space (s, t).
    //
    const Vector3f pn = prev_pos - next_pos;
    const Vector3f cn = tip_pos - next_pos;
    const float pn_norm2_squared = pn.SquaredNorm();
    // Coordinate s of the tip corner C is simply the dot product of the
    // normalized vectors |pn| and |cn| (normalized by the length of |pn|).
    // Since both of these vectors are normalized, we don't need to perform the
    // normalization explicitly and instead we can just use the squared norm
    // of |pn| as a denominator of the resulting dot product of non normalized
    // vectors.
    float s, t;
    // |pn_norm2_squared| can be exactly 0 when the next_pos and prev_pos are
    // the same positions (e.g. because they were quantized to the same
    // location).
    if (version_ < DRACO_BITSTREAM_VERSION(1, 2) || pn_norm2_squared > 0) {
      s = pn.Dot(cn) / pn_norm2_squared;
      // To get the coordinate t, we can use formula:
      //      t = |C-N - (P-N) * s| / |P-N|
      // Do not use std::sqrt to avoid changes in the bitstream.
      t = sqrt((cn - pn * s).SquaredNorm() / pn_norm2_squared);
    } else {
      s = 0;
      t = 0;
    }

    // Now we need to transform the point (s, t) to the texture coordinate space
    // UV. We know the UV coordinates on points N and P (N_UV and P_UV). Lets
    // denote P_UV - N_UV = PN_UV. PN_UV is then 2 dimensional vector that can
    // be used to define transformation from the normalized coordinate system
    // to the texture coordinate system using a 3x3 affine matrix M:
    //
    //  M = | PN_UV[0]  -PN_UV[1]  N_UV[0] |
    //      | PN_UV[1]   PN_UV[0]  N_UV[1] |
    //      | 0          0         1       |
    //
    // The predicted point C_UV in the texture space is then equal to
    // C_UV = M * (s, t, 1). Because the triangle in UV space may be flipped
    // around the PN_UV axis, we also need to consider point C_UV' = M * (s, -t)
    // as the prediction.
    const Vector2f pn_uv = p_uv - n_uv;
    const float pnus = pn_uv[0] * s + n_uv[0];
    const float pnut = pn_uv[0] * t;
    const float pnvs = pn_uv[1] * s + n_uv[1];
    const float pnvt = pn_uv[1] * t;
    Vector2f predicted_uv;
    if (orientations_.empty()) {
      return false;
    }

    // When decoding the data, we already know which orientation to use.
    const bool orientation = orientations_.back();
    orientations_.pop_back();
    if (orientation) {
      predicted_uv = Vector2f(pnus - pnvt, pnvs + pnut);
    } else {
      predicted_uv = Vector2f(pnus + pnvt, pnvs - pnut);
    }
    if (std::is_integral<DataTypeT>::value) {
      // Round the predicted value for integer types.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      const double u = floor(predicted_uv[0] + 0.5);
      if (std::isnan(u) || u > INT_MAX || u < INT_MIN) {
        predicted_value_[0] = INT_MIN;
      } else {
        predicted_value_[0] = static_cast<int>(u);
      }
      const double v = floor(predicted_uv[1] + 0.5);
      if (std::isnan(v) || v > INT_MAX || v < INT_MIN) {
        predicted_value_[1] = INT_MIN;
      } else {
        predicted_value_[1] = static_cast<int>(v);
      }
    } else {
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
    }

    return true;
  }
  // Else we don't have available textures on both corners. For such case we
  // can't use positions for predicting the uv value and we resort to delta
  // coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * num_components_;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * num_components_;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * num_components_;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < num_components_; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < num_components_; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}